

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_dec_octet(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  uint in_EAX;
  uint uVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uStack_8;
  char numberStr [4];
  
  uStack_8 = (ulong)in_EAX;
  lVar2 = -3;
  sVar3 = *offset;
  do {
    if (lVar2 == 0) {
LAB_0018abdd:
      uVar1 = atoi(numberStr);
      return (uint)(0xff < uVar1) * 2;
    }
    pcVar4 = "";
    if (sVar3 < len) {
      pcVar4 = uri + sVar3;
    }
    *offset = sVar3 + 1;
    if (9 < (byte)(*pcVar4 - 0x30U)) {
      *offset = sVar3;
      goto LAB_0018abdd;
    }
    numberStr[lVar2 + 3] = uri[sVar3];
    lVar2 = lVar2 + 1;
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static curi_status parse_dec_octet(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // dec-octet = DIGIT                 ; 0-9
    //           / %x31-39 DIGIT         ; 10-99
    //           / "1" 2DIGIT            ; 100-199
    //           / "2" %x30-34 DIGIT     ; 200-249
    //           / "25" %x30-35          ; 250-255
    int number;
    char numberStr[4] = {'\0', '\0', '\0', '\0'};
    size_t previousOffset;
    size_t i;

    for (i = 0 ; i < 3 ; ++i)
    {
        previousOffset = *offset;
        if (parse_digit(uri, len, offset, settings, userData) !=  curi_status_success)
        {
            *offset = previousOffset;
            break;
        }
        numberStr[i] = uri[previousOffset];
    }

    number = atoi(numberStr);
    if (number >= 0 && number <= 255)
        return curi_status_success;
    else
        return curi_status_error;
}